

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckBuilder.cpp
# Opt level: O1

void __thiscall DeckBuilder::~DeckBuilder(DeckBuilder *this)

{
  list<BlackCard_*,_std::allocator<BlackCard_*>_> *plVar1;
  list<GreenCard_*,_std::allocator<GreenCard_*>_> *plVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  
  p_Var3 = (_List_node_base *)this->black;
  p_Var4 = (((_List_base<BlackCard_*,_std::allocator<BlackCard_*>_> *)&p_Var3->_M_next)->_M_impl).
           _M_node.super__List_node_base._M_next;
  while (p_Var4 != p_Var3) {
    std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::remove
              ((list<BlackCard_*,_std::allocator<BlackCard_*>_> *)p_Var3,(char *)(p_Var4 + 1));
    if (p_Var4[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)(*(long *)p_Var4[1]._M_next + 0x18))();
    }
    p_Var3 = (_List_node_base *)this->black;
    p_Var4 = p_Var3->_M_next->_M_next;
  }
  p_Var3 = (_List_node_base *)this->green;
  p_Var4 = (((_List_base<GreenCard_*,_std::allocator<GreenCard_*>_> *)&p_Var3->_M_next)->_M_impl).
           _M_node.super__List_node_base._M_next;
  while (p_Var4 != p_Var3) {
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::remove
              ((list<GreenCard_*,_std::allocator<GreenCard_*>_> *)p_Var3,(char *)(p_Var4 + 1));
    if (p_Var4[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)(*(long *)p_Var4[1]._M_next + 0x18))();
    }
    p_Var3 = (_List_node_base *)this->green;
    p_Var4 = p_Var3->_M_next->_M_next;
  }
  plVar1 = this->black;
  if (plVar1 != (list<BlackCard_*,_std::allocator<BlackCard_*>_> *)0x0) {
    p_Var3 = (plVar1->super__List_base<BlackCard_*,_std::allocator<BlackCard_*>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    while (p_Var3 != (_List_node_base *)plVar1) {
      p_Var4 = (((_List_base<BlackCard_*,_std::allocator<BlackCard_*>_> *)&p_Var3->_M_next)->_M_impl
               )._M_node.super__List_node_base._M_next;
      operator_delete(p_Var3,0x18);
      p_Var3 = p_Var4;
    }
    operator_delete(plVar1,0x18);
  }
  plVar2 = this->green;
  if (plVar2 == (list<GreenCard_*,_std::allocator<GreenCard_*>_> *)0x0) {
    return;
  }
  p_Var3 = (plVar2->super__List_base<GreenCard_*,_std::allocator<GreenCard_*>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)plVar2) {
    p_Var4 = (((_List_base<GreenCard_*,_std::allocator<GreenCard_*>_> *)&p_Var3->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var4;
  }
  operator_delete(plVar2,0x18);
  return;
}

Assistant:

DeckBuilder::~DeckBuilder()
{
	list<BlackCard *>::iterator it;
	list<GreenCard *>::iterator it2;

	for (it = black->begin(); it != black->end(); it++)
	{
		black->remove((*it));
		delete *it;
		it = black->begin();
	}
	for (it2 = green->begin(); it2 != green->end(); it2++)
	{
		green->remove((*it2));
		delete *it2;
		it2 = green->begin();
	}
	delete black;
	delete green;
}